

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_word_add(fsg_model_t *fsg,char *word)

{
  int iVar1;
  char **ppcVar2;
  bitvec_t *pbVar3;
  char *pcVar4;
  int local_1c;
  int old_size;
  int wid;
  char *word_local;
  fsg_model_t *fsg_local;
  
  local_1c = fsg_model_word_id(fsg,word);
  if (local_1c == -1) {
    local_1c = fsg->n_word;
    if (fsg->n_word == fsg->n_word_alloc) {
      iVar1 = fsg->n_word_alloc;
      fsg->n_word_alloc = fsg->n_word_alloc + 10;
      ppcVar2 = (char **)__ckd_realloc__(fsg->vocab,(long)fsg->n_word_alloc << 3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                         ,0x17e);
      fsg->vocab = ppcVar2;
      if (fsg->silwords != (bitvec_t *)0x0) {
        pbVar3 = bitvec_realloc(fsg->silwords,(long)iVar1,(long)fsg->n_word_alloc);
        fsg->silwords = pbVar3;
      }
      if (fsg->altwords != (bitvec_t *)0x0) {
        pbVar3 = bitvec_realloc(fsg->altwords,(long)iVar1,(long)fsg->n_word_alloc);
        fsg->altwords = pbVar3;
      }
    }
    fsg->n_word = fsg->n_word + 1;
    pcVar4 = __ckd_salloc__(word,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x189);
    fsg->vocab[local_1c] = pcVar4;
  }
  return local_1c;
}

Assistant:

int
fsg_model_word_add(fsg_model_t * fsg, char const *word)
{
    int wid, old_size;

    /* Search for an existing word matching this. */
    wid = fsg_model_word_id(fsg, word);
    /* If not found, add this to the vocab. */
    if (wid == -1) {
        wid = fsg->n_word;
        if (fsg->n_word == fsg->n_word_alloc) {
            old_size = fsg->n_word_alloc;
            fsg->n_word_alloc += 10;
            fsg->vocab = ckd_realloc(fsg->vocab,
                                     fsg->n_word_alloc *
                                     sizeof(*fsg->vocab));
            if (fsg->silwords)
                fsg->silwords =
                    bitvec_realloc(fsg->silwords, old_size,
                                   fsg->n_word_alloc);
            if (fsg->altwords)
                fsg->altwords =
                    bitvec_realloc(fsg->altwords, old_size,
                                   fsg->n_word_alloc);
        }
        ++fsg->n_word;
        fsg->vocab[wid] = ckd_salloc(word);
    }
    return wid;
}